

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O2

bool __thiscall
cmExtraSublimeTextGenerator::Open
          (cmExtraSublimeTextGenerator *this,string *bindir,string *projectName,bool dryRun)

{
  cmake *this_00;
  bool bVar1;
  char *__s;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_cb;
  allocator<char> local_ca;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string filename;
  string local_88;
  string local_68 [32];
  string local_48 [32];
  
  this_00 = ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->CMakeInstance;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"CMAKE_SUBLIMETEXT_EXECUTABLE",(allocator<char> *)&filename);
  __s = cmake::GetCacheDefinition(this_00,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  if ((__s != (char *)0x0) && (bVar1 = cmSystemTools::IsNOTFOUND((char *)0x23b09f), !bVar1)) {
    std::operator+(&local_c8,bindir,"/");
    std::operator+(&local_88,&local_c8,projectName);
    std::operator+(&filename,&local_88,".sublime-project");
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_c8);
    if (dryRun) {
      bVar1 = cmsys::SystemTools::FileExists(&filename,true);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_c9);
      std::__cxx11::string::string<std::allocator<char>>(local_68,"--project",&local_ca);
      std::__cxx11::string::string(local_48,(string *)&filename);
      __l._M_len = 3;
      __l._M_array = &local_88;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_c8,__l,&local_cb);
      bVar1 = cmSystemTools::RunSingleCommand
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_c8,(string *)0x0,(string *)0x0,(int *)0x0,(char *)0x0,
                         OUTPUT_MERGE,(cmDuration)0x0,Auto);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_c8);
      lVar2 = 0x40;
      do {
        std::__cxx11::string::~string((string *)((long)&local_88._M_dataplus._M_p + lVar2));
        lVar2 = lVar2 + -0x20;
      } while (lVar2 != -0x20);
    }
    std::__cxx11::string::~string((string *)&filename);
    return bVar1;
  }
  return false;
}

Assistant:

bool cmExtraSublimeTextGenerator::Open(const std::string& bindir,
                                       const std::string& projectName,
                                       bool dryRun)
{
  const char* sublExecutable =
    this->GlobalGenerator->GetCMakeInstance()->GetCacheDefinition(
      "CMAKE_SUBLIMETEXT_EXECUTABLE");
  if (!sublExecutable) {
    return false;
  }
  if (cmSystemTools::IsNOTFOUND(sublExecutable)) {
    return false;
  }

  std::string filename = bindir + "/" + projectName + ".sublime-project";
  if (dryRun) {
    return cmSystemTools::FileExists(filename, true);
  }

  return cmSystemTools::RunSingleCommand(
    { sublExecutable, "--project", filename });
}